

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteVar(Bac_Ntk_t *p,int RealName)

{
  char cVar1;
  uint uVar2;
  size_t __size;
  char *__s;
  size_t sVar3;
  void *pvVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  uint *puVar5;
  ulong uVar6;
  
  puVar5 = (uint *)CONCAT44(in_register_00000034,RealName);
  __s = Abc_NamStr((Abc_Nam_t *)p,in_EDX);
  sVar3 = strlen(__s);
  if (0 < (int)(uint)sVar3) {
    uVar6 = 0;
    do {
      cVar1 = __s[uVar6];
      uVar2 = puVar5[1];
      if (uVar2 == *puVar5) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(puVar5 + 2) == (void *)0x0) {
            pvVar4 = malloc(0x10);
          }
          else {
            pvVar4 = realloc(*(void **)(puVar5 + 2),0x10);
          }
          *(void **)(puVar5 + 2) = pvVar4;
          *puVar5 = 0x10;
        }
        else {
          __size = (ulong)uVar2 * 2;
          if (*(void **)(puVar5 + 2) == (void *)0x0) {
            pvVar4 = malloc(__size);
          }
          else {
            pvVar4 = realloc(*(void **)(puVar5 + 2),__size);
          }
          *(void **)(puVar5 + 2) = pvVar4;
          *puVar5 = (uint)__size;
        }
      }
      else {
        pvVar4 = *(void **)(puVar5 + 2);
      }
      uVar2 = puVar5[1];
      puVar5[1] = uVar2 + 1;
      *(char *)((long)pvVar4 + (long)(int)uVar2) = cVar1;
      uVar6 = uVar6 + 1;
    } while (((uint)sVar3 & 0x7fffffff) != uVar6);
  }
  return;
}

Assistant:

static inline void Bac_ManWriteVar( Bac_Ntk_t * p, int RealName )
{
    Vec_StrPrintStr( p->pDesign->vOut, Bac_NtkStr(p, RealName) );
}